

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  uint64_t *puVar5;
  uint uVar6;
  uint offset;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  secp256k1_scalar s;
  
  puVar5 = (uint64_t *)CONCAT44(in_register_00000034,len);
  iVar9 = 0;
  memset(wnaf,0,0x204);
  s.d[2] = puVar5[2];
  s.d[3] = puVar5[3];
  s.d[0] = *puVar5;
  s.d[1] = puVar5[1];
  uVar4 = 0xffffffffffffffff;
  if ((long)puVar5[3] < 0) {
    secp256k1_scalar_negate(&s,&s);
    iVar2 = -1;
  }
  else {
    iVar2 = 1;
  }
  uVar3 = (uint)a;
  uVar6 = 0;
  do {
    uVar7 = (ulong)iVar9;
    uVar8 = 0x81 - iVar9;
    while( true ) {
      offset = (uint)uVar7;
      if (0x80 < (int)offset) {
        return (int)uVar4 + 1;
      }
      if (((s.d[uVar7 >> 6 & 0x3ffffff] >> (uVar7 & 0x3f) & 1) != 0) != uVar6) break;
      uVar7 = uVar7 + 1;
      uVar8 = uVar8 - 1;
    }
    uVar1 = 0x81 - offset;
    if ((int)uVar3 <= (int)(0x81 - offset)) {
      uVar1 = uVar3;
    }
    uVar1 = secp256k1_scalar_get_bits_var(&s,offset,uVar1);
    uVar1 = uVar1 + uVar6;
    bVar10 = (uVar1 >> (uVar3 - 1 & 0x1f) & 1) != 0;
    uVar6 = (uint)bVar10;
    wnaf[uVar7] = (uVar1 - ((uint)bVar10 << ((byte)a & 0x1f))) * iVar2;
    if ((int)uVar3 < (int)uVar8) {
      uVar8 = uVar3;
    }
    iVar9 = uVar8 + offset;
    uVar4 = uVar7 & 0xffffffff;
  } while( true );
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    memset(wnaf, 0, len * sizeof(wnaf[0]));

    s = *a;
    if (secp256k1_scalar_get_bits(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}